

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O0

void __thiscall UEFITool::showBuilderMessages(UEFITool *this)

{
  bool bVar1;
  QListWidgetItem *this_00;
  QByteArray local_98;
  QVariant local_80;
  QListWidgetItem *local_50;
  QListWidgetItem *item;
  pair<QString,_QModelIndex> *msg;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
  *__range1;
  vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
  messages;
  UEFITool *this_local;
  
  messages.
  super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  QListWidget::clear();
  if (this->ffsBuilder != (FfsBuilder *)0x0) {
    FfsBuilder::getMessages
              ((vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
                *)&__range1,this->ffsBuilder);
    __end1 = std::
             vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
             ::begin((vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
                      *)&__range1);
    msg = (pair<QString,_QModelIndex> *)
          std::
          vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
          ::end((vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
                 *)&__range1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::pair<QString,_QModelIndex>_*,_std::vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>_>
                                       *)&msg), bVar1) {
      item = (QListWidgetItem *)
             __gnu_cxx::
             __normal_iterator<std::pair<QString,_QModelIndex>_*,_std::vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>_>
             ::operator*(&__end1);
      this_00 = (QListWidgetItem *)operator_new(0x28);
      QListWidgetItem::QListWidgetItem(this_00,(QString *)item,(QListWidget *)0x0,0);
      local_50 = this_00;
      QByteArray::QByteArray(&local_98,(char *)(item + 0x18),0x18);
      QVariant::QVariant(&local_80,&local_98);
      (**(code **)(*(long *)this_00 + 0x20))(this_00,0x100,&local_80);
      QVariant::~QVariant(&local_80);
      QByteArray::~QByteArray(&local_98);
      QListWidget::addItem(*(QListWidget **)(this->ui + 0x1d0),local_50);
      __gnu_cxx::
      __normal_iterator<std::pair<QString,_QModelIndex>_*,_std::vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>_>
      ::operator++(&__end1);
    }
    QTabWidget::setTabEnabled((int)*(undefined8 *)(this->ui + 0x150),true);
    QTabWidget::setCurrentIndex((int)*(undefined8 *)(this->ui + 0x150));
    QAbstractItemView::scrollToBottom();
    std::vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
    ::~vector((vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
               *)&__range1);
  }
  return;
}

Assistant:

void UEFITool::showBuilderMessages()
{
    ui->builderMessagesListWidget->clear();
    if (!ffsBuilder)
        return;
    
    std::vector<std::pair<QString, QModelIndex> > messages = ffsBuilder->getMessages();
    
    for (const auto &msg : messages) {
        QListWidgetItem* item = new QListWidgetItem(msg.first, NULL, 0);
        item->setData(Qt::UserRole, QByteArray((const char*)&msg.second, sizeof(msg.second)));
        ui->builderMessagesListWidget->addItem(item);
    }
    
    ui->messagesTabWidget->setTabEnabled(TAB_BUILDER, true);
    ui->messagesTabWidget->setCurrentIndex(TAB_BUILDER);
    ui->builderMessagesListWidget->scrollToBottom();
}